

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiNavLayer IVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar6;
  
  pIVar3 = GImGui;
  auVar5 = in_ZMM0._8_56_;
  IVar1 = (window->DC).NavLayerCurrent;
  if (GImGui->NavWindow != window) {
    GImGui->NavInitRequest = false;
  }
  pIVar3->NavWindow = window;
  pIVar3->NavId = id;
  pIVar3->NavLayer = IVar1;
  pIVar3->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
  window->NavLastIds[IVar1] = id;
  if ((pIVar3->LastItemData).ID == id) {
    IVar6 = WindowRectAbsToRel(window,&(pIVar3->LastItemData).NavRect);
    auVar4._0_8_ = IVar6.Min;
    auVar4._8_56_ = auVar5;
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_4_ = IVar6.Max.x;
    auVar2._4_4_ = IVar6.Max.y;
    IVar6 = (ImRect)vmovlhps_avx(auVar4._0_16_,auVar2);
    window->NavRectRel[IVar1] = IVar6;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar3->NavDisableMouseHover = true;
  }
  else {
    pIVar3->NavDisableHighlight = true;
  }
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}